

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O2

Status __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_solveRealStable(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,bool acceptUnbounded,bool acceptInfeasible,
                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *primal,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *dual,
                  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                  *basisStatusRows,
                  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                  *basisStatusCols,bool forceNoSimplifier)

{
  bool bVar1;
  Verbosity VVar2;
  Settings *pSVar3;
  int value;
  bool bVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  type_conflict5 tVar6;
  Status SVar7;
  SPxOut *pSVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 uVar11;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined8 uVar9;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  undefined7 extraout_var_06;
  SPxOut *pSVar10;
  undefined7 in_register_00000011;
  bool bVar12;
  Verbosity old_verbosity_2;
  undefined7 in_register_00000031;
  bool bVar13;
  Verbosity old_verbosity;
  bool bVar14;
  Verbosity old_verbosity_1;
  bool fromscratch;
  undefined7 uStack_33f;
  double local_330;
  ulong local_328;
  int local_320;
  int local_31c;
  ulong local_318;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_310;
  int local_304;
  int local_300;
  int local_2fc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  ulong local_2f0;
  undefined8 local_2e8;
  int local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  ulong local_2c8;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2c0;
  ulong local_2b8;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2b0;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2a8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2a0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_298;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_290;
  cpp_dec_float<50U,_int,_void> local_288;
  cpp_dec_float<50U,_int,_void> local_248;
  cpp_dec_float<50U,_int,_void> local_208;
  uint local_1c8 [2];
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [6];
  undefined8 uStack_190;
  cpp_dec_float<50U,_int,_void> local_188;
  cpp_dec_float<50U,_int,_void> local_150;
  cpp_dec_float<50U,_int,_void> local_118;
  cpp_dec_float<50U,_int,_void> local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_2d8 = (undefined4)CONCAT71(in_register_00000011,acceptInfeasible);
  local_2d4 = (undefined4)CONCAT71(in_register_00000031,acceptUnbounded);
  local_1a8._0_8_ = *(undefined8 *)((this->_slufactor).lastThreshold.m_backend.data._M_elems + 8);
  local_1c8 = *(uint (*) [2])(this->_slufactor).lastThreshold.m_backend.data._M_elems;
  auStack_1c0 = *(uint (*) [2])((this->_slufactor).lastThreshold.m_backend.data._M_elems + 2);
  local_1b8 = *(uint (*) [2])((this->_slufactor).lastThreshold.m_backend.data._M_elems + 4);
  auStack_1b0 = *(uint (*) [2])((this->_slufactor).lastThreshold.m_backend.data._M_elems + 6);
  local_2dc = (this->_slufactor).lastThreshold.m_backend.exp;
  bVar1 = (this->_slufactor).lastThreshold.m_backend.neg;
  local_1a8[4] = (this->_slufactor).lastThreshold.m_backend.fpclass;
  local_1a8[5] = (this->_slufactor).lastThreshold.m_backend.prec_elem;
  uStack_190 = 0;
  pSVar3 = this->_currentSettings;
  local_300 = pSVar3->_intParamValues[0xe];
  local_2fc = pSVar3->_intParamValues[0xd];
  local_304 = pSVar3->_intParamValues[2];
  local_320 = pSVar3->_intParamValues[10];
  local_31c = pSVar3->_intParamValues[0xb];
  local_2a0 = primal;
  local_298 = dual;
  local_290 = basisStatusRows;
  if (forceNoSimplifier) {
    setIntParam(this,SIMPLIFIER,0,true);
  }
  local_2c0 = &this->_slufactor;
  pSVar10 = &this->spxout;
  local_310 = &this->_solver;
  local_2f8 = &(this->_solver).entertolscale;
  local_2d0 = &(this->_solver).leavetolscale;
  local_2a8 = &(this->_ratiotesterTextbook).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_2b0 = &(this->_pricerDevex).
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  bVar13 = true;
  local_2c8 = 0;
  bVar4 = false;
  local_2e8 = 0;
  local_318 = 0;
  local_2f0 = 0;
  local_2b8 = 0;
  local_328 = 0;
  bVar12 = false;
  bVar14 = false;
  fromscratch = false;
LAB_002b4174:
  SVar7 = _solveRealForRational(this,fromscratch,local_2a0,local_298,local_290,basisStatusCols);
  if (SVar7 == INFEASIBLE) {
    if ((char)local_2d8 != '\0') goto LAB_002b4bb1;
  }
  else if (SVar7 == OPTIMAL) goto LAB_002b4bb1;
  if ((((byte)local_2d4 & SVar7 == UNBOUNDED) != 0) || ((uint)(SVar7 + (INForUNBD|INFEASIBLE)) < 2))
  goto LAB_002b4bb1;
  if ((bVar13) && (VVar2 = (this->spxout).m_verbosity, 2 < (int)VVar2)) {
    (this->spxout).m_verbosity = INFO1;
    pSVar8 = soplex::operator<<(pSVar10,"Numerical troubles during floating-point solve.");
    std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
    (this->spxout).m_verbosity = VVar2;
  }
  if (((local_2b8 & 1) == 0) &&
     ((this->_currentSettings->_intParamValues[10] != 0 ||
      (this->_currentSettings->_intParamValues[0xb] != 0)))) {
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      pSVar8 = soplex::operator<<(pSVar10,"Turning off preprocessing.");
      std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
      (this->spxout).m_verbosity = VVar2;
    }
    setIntParam(this,SCALER,0,true);
    setIntParam(this,SIMPLIFIER,0,true);
    local_2b8 = CONCAT71(extraout_var,1);
  }
  else {
    setIntParam(this,SCALER,local_31c,true);
    setIntParam(this,SIMPLIFIER,local_320,true);
    if (!bVar12) {
      VVar2 = (this->spxout).m_verbosity;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        pSVar8 = soplex::operator<<(pSVar10,"Increasing Markowitz threshold.");
        std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
        (this->spxout).m_verbosity = VVar2;
      }
      bVar13 = false;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_68,0.9,(type *)0x0);
      SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setMarkowitz(local_2c0,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_68);
      bVar12 = true;
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::factorize(local_310);
      goto LAB_002b4174;
    }
    if (!bVar14) {
      VVar2 = (this->spxout).m_verbosity;
      bVar12 = true;
      bVar13 = false;
      bVar14 = true;
      fromscratch = true;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        pSVar8 = soplex::operator<<(pSVar10,"Solving from scratch.");
        std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
        (this->spxout).m_verbosity = VVar2;
        goto LAB_002b43f8;
      }
      goto LAB_002b4174;
    }
    setIntParam(this,RATIOTESTER,local_300,true);
    setIntParam(this,PRICER,local_2fc,true);
    if (bVar4) {
      if ((((byte)local_2e8 | forceNoSimplifier) & 1) != 0) {
        setIntParam(this,SIMPLIFIER,0,true);
        if ((local_328 & 1) == 0) {
          VVar2 = (this->spxout).m_verbosity;
          if (2 < (int)VVar2) {
            (this->spxout).m_verbosity = INFO1;
            pSVar8 = soplex::operator<<(pSVar10,"Relaxing tolerances.");
            std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
            (this->spxout).m_verbosity = VVar2;
          }
          pSVar5 = local_310;
          if ((DAT_0054bdc8 < 1) && (-1 < DAT_0054be38)) {
            this->_currentSettings->_intParamValues[2] = 0;
          }
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_e0,local_310);
          local_330 = 1e-06;
          tVar6 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_e0,&local_330);
          if (tVar6) {
            local_330 = 0.001;
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_e0,pSVar5);
            local_208.fpclass = cpp_dec_float_finite;
            local_208.prec_elem = 10;
            local_208.data._M_elems[0] = 0;
            local_208.data._M_elems[1] = 0;
            local_208.data._M_elems[2] = 0;
            local_208.data._M_elems[3] = 0;
            local_208.data._M_elems[4] = 0;
            local_208.data._M_elems[5] = 0;
            local_208.data._M_elems._24_5_ = 0;
            local_208.data._M_elems[7]._1_3_ = 0;
            local_208.data._M_elems._32_5_ = 0;
            local_208.data._M_elems[9]._1_3_ = 0;
            local_208.exp = 0;
            local_208.neg = false;
            boost::multiprecision::default_ops::
            eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                      (&local_208,&local_330,&local_e0);
            *(ulong *)((local_2f8->m_backend).data._M_elems + 8) =
                 CONCAT35(local_208.data._M_elems[9]._1_3_,local_208.data._M_elems._32_5_);
            *(undefined8 *)((local_2f8->m_backend).data._M_elems + 4) =
                 local_208.data._M_elems._16_8_;
            *(ulong *)((local_2f8->m_backend).data._M_elems + 6) =
                 CONCAT35(local_208.data._M_elems[7]._1_3_,local_208.data._M_elems._24_5_);
            *(undefined8 *)(local_2f8->m_backend).data._M_elems = local_208.data._M_elems._0_8_;
            *(undefined8 *)((local_2f8->m_backend).data._M_elems + 2) =
                 local_208.data._M_elems._8_8_;
            (this->_solver).entertolscale.m_backend.exp = local_208.exp;
            (this->_solver).entertolscale.m_backend.neg = local_208.neg;
            uVar9 = local_208._48_8_;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&local_118,1000.0,(type *)0x0);
            *(undefined8 *)((local_2f8->m_backend).data._M_elems + 8) =
                 local_118.data._M_elems._32_8_;
            *(undefined8 *)((local_2f8->m_backend).data._M_elems + 4) =
                 local_118.data._M_elems._16_8_;
            *(undefined8 *)((local_2f8->m_backend).data._M_elems + 6) =
                 local_118.data._M_elems._24_8_;
            *(undefined8 *)(local_2f8->m_backend).data._M_elems = local_118.data._M_elems._0_8_;
            *(undefined8 *)((local_2f8->m_backend).data._M_elems + 2) =
                 local_118.data._M_elems._8_8_;
            (this->_solver).entertolscale.m_backend.exp = local_118.exp;
            (this->_solver).entertolscale.m_backend.neg = local_118.neg;
            uVar9 = local_118._48_8_;
          }
          (this->_solver).entertolscale.m_backend.fpclass = (fpclass_type)uVar9;
          (this->_solver).entertolscale.m_backend.prec_elem = SUB84(uVar9,4);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::leavetol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_e0,pSVar5);
          local_330 = 1e-06;
          tVar6 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_e0,&local_330);
          if (tVar6) {
            local_330 = 0.001;
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::leavetol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_e0,pSVar5);
            local_248.fpclass = cpp_dec_float_finite;
            local_248.prec_elem = 10;
            local_248.data._M_elems[0] = 0;
            local_248.data._M_elems[1] = 0;
            local_248.data._M_elems[2] = 0;
            local_248.data._M_elems[3] = 0;
            local_248.data._M_elems[4] = 0;
            local_248.data._M_elems[5] = 0;
            local_248.data._M_elems._24_5_ = 0;
            local_248.data._M_elems[7]._1_3_ = 0;
            local_248.data._M_elems._32_5_ = 0;
            local_248.data._M_elems[9]._1_3_ = 0;
            local_248.exp = 0;
            local_248.neg = false;
            boost::multiprecision::default_ops::
            eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                      (&local_248,&local_330,&local_e0);
            *(ulong *)((local_2d0->m_backend).data._M_elems + 8) =
                 CONCAT35(local_248.data._M_elems[9]._1_3_,local_248.data._M_elems._32_5_);
            *(undefined8 *)((local_2d0->m_backend).data._M_elems + 4) =
                 local_248.data._M_elems._16_8_;
            *(ulong *)((local_2d0->m_backend).data._M_elems + 6) =
                 CONCAT35(local_248.data._M_elems[7]._1_3_,local_248.data._M_elems._24_5_);
            *(undefined8 *)(local_2d0->m_backend).data._M_elems = local_248.data._M_elems._0_8_;
            *(undefined8 *)((local_2d0->m_backend).data._M_elems + 2) =
                 local_248.data._M_elems._8_8_;
            (this->_solver).leavetolscale.m_backend.exp = local_248.exp;
            (this->_solver).leavetolscale.m_backend.neg = local_248.neg;
            uVar9 = local_248._48_8_;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&local_150,1000.0,(type *)0x0);
            *(undefined8 *)((local_2d0->m_backend).data._M_elems + 8) =
                 local_150.data._M_elems._32_8_;
            *(undefined8 *)((local_2d0->m_backend).data._M_elems + 4) =
                 local_150.data._M_elems._16_8_;
            *(undefined8 *)((local_2d0->m_backend).data._M_elems + 6) =
                 local_150.data._M_elems._24_8_;
            *(undefined8 *)(local_2d0->m_backend).data._M_elems = local_150.data._M_elems._0_8_;
            *(undefined8 *)((local_2d0->m_backend).data._M_elems + 2) =
                 local_150.data._M_elems._8_8_;
            (this->_solver).leavetolscale.m_backend.exp = local_150.exp;
            (this->_solver).leavetolscale.m_backend.neg = local_150.neg;
            uVar9 = local_150._48_8_;
          }
          (this->_solver).leavetolscale.m_backend.fpclass = (fpclass_type)uVar9;
          (this->_solver).leavetolscale.m_backend.prec_elem = SUB84(uVar9,4);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_e0,pSVar5);
          local_330 = 0.001;
          tVar6 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_e0,&local_330);
          local_328 = CONCAT71(extraout_var_02,tVar6);
        }
        else {
          if (SVar7 == INFEASIBLE || (local_2c8 & 1) != 0) {
            if ((DAT_0054bdc8 <= local_304) && (local_304 <= DAT_0054be38)) {
              this->_currentSettings->_intParamValues[2] = local_304;
            }
            VVar2 = (this->spxout).m_verbosity;
            if ((local_318 & 1) == 0) {
              if (2 < (int)VVar2) {
                (this->spxout).m_verbosity = INFO1;
                pSVar8 = soplex::operator<<(pSVar10,"Switching ratio test.");
                std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
                (this->spxout).m_verbosity = VVar2;
              }
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::setType(local_310,(uint)((this->_solver).theType != LEAVE) * 2 + ENTER);
              if ((this->_solver).theratiotester == local_2a8) {
                setIntParam(this,RATIOTESTER,2,true);
                uStack_33f = extraout_var_05;
              }
              else {
                setIntParam(this,RATIOTESTER,0,true);
                uStack_33f = extraout_var_03;
              }
              local_318 = CONCAT71(uStack_33f,1);
            }
            else {
              if ((local_2f0 & 1) != 0) {
                if (2 < (int)VVar2) {
                  (this->spxout).m_verbosity = INFO1;
                  pSVar10 = soplex::operator<<(pSVar10,"Giving up.");
                  std::endl<char,std::char_traits<char>>(pSVar10->m_streams[pSVar10->m_verbosity]);
                  (this->spxout).m_verbosity = VVar2;
                }
LAB_002b4bb1:
                local_a8.m_backend.data._M_elems[8] = local_1a8[0];
                local_a8.m_backend.data._M_elems[9] = local_1a8[1];
                local_a8.m_backend.data._M_elems[4] = local_1b8[0];
                local_a8.m_backend.data._M_elems[5] = local_1b8[1];
                local_a8.m_backend.data._M_elems[6] = auStack_1b0[0];
                local_a8.m_backend.data._M_elems[7] = auStack_1b0[1];
                local_a8.m_backend.data._M_elems[0] = local_1c8[0];
                local_a8.m_backend.data._M_elems[1] = local_1c8[1];
                local_a8.m_backend.data._M_elems[2] = auStack_1c0[0];
                local_a8.m_backend.data._M_elems[3] = auStack_1c0[1];
                local_a8.m_backend.exp = local_2dc;
                local_a8.m_backend.fpclass = local_1a8[4];
                local_a8.m_backend.prec_elem = local_1a8[5];
                local_a8.m_backend.neg = bVar1;
                SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::setMarkowitz(local_2c0,&local_a8);
                setIntParam(this,RATIOTESTER,local_300,true);
                setIntParam(this,PRICER,local_2fc,true);
                setIntParam(this,SIMPLIFIER,local_320,true);
                setIntParam(this,SCALER,local_31c,true);
                if ((DAT_0054bdc8 <= local_304) && (local_304 <= DAT_0054be38)) {
                  this->_currentSettings->_intParamValues[2] = local_304;
                }
                return SVar7;
              }
              if (2 < (int)VVar2) {
                (this->spxout).m_verbosity = INFO1;
                pSVar8 = soplex::operator<<(pSVar10,"Switching pricer.");
                std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
                (this->spxout).m_verbosity = VVar2;
              }
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::setType(local_310,(uint)((this->_solver).theType != LEAVE) * 2 + ENTER);
              if ((this->_solver).thepricer == local_2b0) {
                value = 5;
              }
              else {
                value = 3;
              }
              setIntParam(this,PRICER,value,true);
              local_318 = CONCAT71(extraout_var_06,1);
              local_2f0 = CONCAT71(extraout_var_06,1);
              uStack_33f = extraout_var_06;
            }
          }
          else {
            VVar2 = (this->spxout).m_verbosity;
            if (2 < (int)VVar2) {
              (this->spxout).m_verbosity = INFO1;
              pSVar8 = soplex::operator<<(pSVar10,"Tightening tolerances.");
              std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
              (this->spxout).m_verbosity = VVar2;
            }
            pSVar5 = local_310;
            if ((DAT_0054bdc8 < 2) && (0 < DAT_0054be38)) {
              this->_currentSettings->_intParamValues[2] = 1;
            }
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_e0,local_310);
            local_330 = 1e-06;
            tVar6 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_e0,&local_330);
            if (tVar6) {
              local_330 = 1e-09;
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_e0,pSVar5);
              local_288.fpclass = cpp_dec_float_finite;
              local_288.prec_elem = 10;
              local_288.data._M_elems[0] = 0;
              local_288.data._M_elems[1] = 0;
              local_288.data._M_elems[2] = 0;
              local_288.data._M_elems[3] = 0;
              local_288.data._M_elems[4] = 0;
              local_288.data._M_elems[5] = 0;
              local_288.data._M_elems._24_5_ = 0;
              local_288.data._M_elems[7]._1_3_ = 0;
              local_288.data._M_elems._32_5_ = 0;
              local_288.data._M_elems[9]._1_3_ = 0;
              local_288.exp = 0;
              local_288.neg = false;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                        (&local_288,&local_330,&local_e0);
              *(ulong *)((local_2f8->m_backend).data._M_elems + 8) =
                   CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
              *(undefined8 *)((local_2f8->m_backend).data._M_elems + 4) =
                   local_288.data._M_elems._16_8_;
              *(ulong *)((local_2f8->m_backend).data._M_elems + 6) =
                   CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
              *(undefined8 *)(local_2f8->m_backend).data._M_elems = local_288.data._M_elems._0_8_;
              *(undefined8 *)((local_2f8->m_backend).data._M_elems + 2) =
                   local_288.data._M_elems._8_8_;
              (this->_solver).entertolscale.m_backend.exp = local_288.exp;
              (this->_solver).entertolscale.m_backend.neg = local_288.neg;
              uVar9 = local_288._48_8_;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (&local_188,0.001,(type *)0x0);
              *(undefined8 *)((local_2f8->m_backend).data._M_elems + 8) =
                   local_188.data._M_elems._32_8_;
              *(undefined8 *)((local_2f8->m_backend).data._M_elems + 4) =
                   local_188.data._M_elems._16_8_;
              *(undefined8 *)((local_2f8->m_backend).data._M_elems + 6) =
                   local_188.data._M_elems._24_8_;
              *(undefined8 *)(local_2f8->m_backend).data._M_elems = local_188.data._M_elems._0_8_;
              *(undefined8 *)((local_2f8->m_backend).data._M_elems + 2) =
                   local_188.data._M_elems._8_8_;
              (this->_solver).entertolscale.m_backend.exp = local_188.exp;
              (this->_solver).entertolscale.m_backend.neg = local_188.neg;
              uVar9 = local_188._48_8_;
            }
            (this->_solver).entertolscale.m_backend.fpclass = (fpclass_type)uVar9;
            (this->_solver).entertolscale.m_backend.prec_elem = SUB84(uVar9,4);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_e0,pSVar5);
            local_330 = 1e-09;
            tVar6 = boost::multiprecision::operator<=
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_e0,&local_330);
            local_2c8 = CONCAT71(extraout_var_04,tVar6);
            uStack_33f = extraout_var_04;
          }
          local_328 = CONCAT71(uStack_33f,1);
        }
        bVar4 = true;
        bVar13 = false;
        bVar12 = true;
        bVar14 = false;
        goto LAB_002b4174;
      }
      VVar2 = (this->spxout).m_verbosity;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        pSVar8 = soplex::operator<<(pSVar10,"Switching simplification.");
        std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
        (this->spxout).m_verbosity = VVar2;
      }
      if (local_320 == 0) {
        setIntParam(this,SIMPLIFIER,3,true);
        uVar11 = extraout_var_01;
      }
      else {
        setIntParam(this,SIMPLIFIER,0,true);
        uVar11 = extraout_var_00;
      }
      local_2e8 = CONCAT71(uVar11,1);
    }
    else {
      VVar2 = (this->spxout).m_verbosity;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        pSVar8 = soplex::operator<<(pSVar10,"Switching scaling.");
        std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
        (this->spxout).m_verbosity = VVar2;
      }
      if (local_31c == 0) {
        setIntParam(this,SCALER,2,true);
      }
      else {
        setIntParam(this,SCALER,0,true);
      }
    }
    bVar4 = true;
    bVar12 = true;
  }
LAB_002b43f8:
  bVar13 = false;
  bVar14 = true;
  fromscratch = true;
  goto LAB_002b4174;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::_solveRealStable(bool acceptUnbounded,
      bool acceptInfeasible, VectorBase<R>& primal, VectorBase<R>& dual,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusRows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusCols,
      const bool forceNoSimplifier)
{
   typename SPxSolverBase<R>::Status result = SPxSolverBase<R>::UNKNOWN;

   bool fromScratch = false;
   bool solved = false;
   bool solvedFromScratch = false;
   bool initialSolve = true;
   bool increasedMarkowitz = false;
   bool relaxedTolerances = false;
   bool tightenedTolerances = false;
   bool switchedScaler = false;
   bool switchedSimplifier = false;
   bool switchedRatiotester = false;
   bool switchedPricer = false;
   bool turnedoffPre = false;

   R markowitz = _slufactor.markowitz();
   int ratiotester = intParam(SoPlexBase<R>::RATIOTESTER);
   int pricer = intParam(SoPlexBase<R>::PRICER);
   int simplifier = intParam(SoPlexBase<R>::SIMPLIFIER);
   int scaler = intParam(SoPlexBase<R>::SCALER);
   int type = intParam(SoPlexBase<R>::ALGORITHM);

   if(forceNoSimplifier)
      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

   while(true)
   {
      assert(!increasedMarkowitz || GE(_slufactor.markowitz(), R(0.9), this->tolerances()->epsilon()));

      result = _solveRealForRational(fromScratch, primal, dual, basisStatusRows, basisStatusCols);

      solved = (result == SPxSolverBase<R>::OPTIMAL)
               || (result == SPxSolverBase<R>::INFEASIBLE && acceptInfeasible)
               || (result == SPxSolverBase<R>::UNBOUNDED && acceptUnbounded);

      if(solved || result == SPxSolverBase<R>::ABORT_TIME || result == SPxSolverBase<R>::ABORT_ITER)
         break;

      if(initialSolve)
      {
         SPX_MSG_INFO1(spxout, spxout << "Numerical troubles during floating-point solve." << std::endl);
         initialSolve = false;
      }

      if(!turnedoffPre
            && (intParam(SoPlexBase<R>::SIMPLIFIER) != SoPlexBase<R>::SIMPLIFIER_OFF
                || intParam(SoPlexBase<R>::SCALER) != SoPlexBase<R>::SCALER_OFF))
      {
         SPX_MSG_INFO1(spxout, spxout << "Turning off preprocessing." << std::endl);

         turnedoffPre = true;

         setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);
         setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SCALER, scaler);
      setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);

      if(!increasedMarkowitz)
      {
         SPX_MSG_INFO1(spxout, spxout << "Increasing Markowitz threshold." << std::endl);

         _slufactor.setMarkowitz(0.9);
         increasedMarkowitz = true;

         try
         {
            _solver.factorize();
            continue;
         }
         catch(...)
         {
            SPxOut::debug(this, "Factorization failed.\n");
         }
      }

      if(!solvedFromScratch)
      {
         SPX_MSG_INFO1(spxout, spxout << "Solving from scratch." << std::endl);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
      setIntParam(SoPlexBase<R>::PRICER, pricer);

      if(!switchedScaler)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching scaling." << std::endl);

         if(scaler == int(SoPlexBase<R>::SCALER_OFF))
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_BIEQUI);
         else
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedScaler = true;
         continue;
      }

      if(!switchedSimplifier && !forceNoSimplifier)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching simplification." << std::endl);

         if(simplifier == int(SoPlexBase<R>::SIMPLIFIER_OFF))
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_INTERNAL);
         else
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedSimplifier = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

      if(!relaxedTolerances)
      {
         SPX_MSG_INFO1(spxout, spxout << "Relaxing tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_PRIMAL);

         // scale tols by up 1e3 but so that they do not exceed 1e-3
         if(_solver.entertol() > 1e-6)
            _solver.scaleEntertol(1e-3 / _solver.entertol());
         else
            _solver.scaleEntertol(1e3);

         if(_solver.leavetol() > 1e-6)
            _solver.scaleLeavetol(1e-3 / _solver.leavetol());
         else
            _solver.scaleLeavetol(1e3);

         relaxedTolerances = _solver.entertol() >= 1e-3;
         solvedFromScratch = false;
         continue;
      }

      if(!tightenedTolerances && result != SPxSolverBase<R>::INFEASIBLE)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tightening tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_DUAL);

         // scale tols by up 1e-3 but so that they are not smaller than 1e-9
         if(_solver.entertol() < 1e-6)
            _solver.scaleEntertol(1e-9 / _solver.entertol());
         else
            _solver.scaleEntertol(1e-3);

         tightenedTolerances = _solver.entertol() <= 1e-9;
         solvedFromScratch = false;
         continue;
      }

      setIntParam(SoPlexBase<R>::ALGORITHM, type);

      if(!switchedRatiotester)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching ratio test." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.ratiotester() != (SPxRatioTester<R>*)&_ratiotesterTextbook)
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_TEXTBOOK);
         else
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_FAST);

         switchedRatiotester = true;
         solvedFromScratch = false;
         continue;
      }

      if(!switchedPricer)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching pricer." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.pricer() != (SPxPricer<R>*)&_pricerDevex)
            setIntParam(SoPlexBase<R>::PRICER, PRICER_DEVEX);
         else
            setIntParam(SoPlexBase<R>::PRICER, PRICER_STEEP);

         switchedPricer = true;
         solvedFromScratch = false;
         continue;
      }

      SPX_MSG_INFO1(spxout, spxout << "Giving up." << std::endl);

      break;
   }

   _slufactor.setMarkowitz(markowitz);

   setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
   setIntParam(SoPlexBase<R>::PRICER, pricer);
   setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);
   setIntParam(SoPlexBase<R>::SCALER, scaler);
   setIntParam(SoPlexBase<R>::ALGORITHM, type);

   return result;
}